

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileStoreTestCase.cpp
# Opt level: O0

void __thiscall fileStoreFixture::~fileStoreFixture(fileStoreFixture *this)

{
  allocator<char> local_59;
  string local_58;
  allocator<char> local_31;
  string local_30;
  fileStoreFixture *local_10;
  fileStoreFixture *this_local;
  
  local_10 = this;
  FIX::FileStoreFactory::destroy((MessageStore *)this);
  if ((this->resetAfter & 1U) != 0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"SETGET",&local_31);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_58,"TEST",&local_59);
    FIX::deleteSession(&local_30,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    std::allocator<char>::~allocator(&local_59);
    std::__cxx11::string::~string((string *)&local_30);
    std::allocator<char>::~allocator(&local_31);
  }
  FIX::FileStoreFactory::~FileStoreFactory(&this->factory);
  return;
}

Assistant:

~fileStoreFixture() {
    factory.destroy(object);

    if (resetAfter) {
      deleteSession("SETGET", "TEST");
    }
  }